

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O3

int is_from_client(sockaddr *addr)

{
  sockaddr sVar1;
  sockaddr sVar2;
  sockaddr sVar3;
  sockaddr sVar4;
  sockaddr sVar5;
  int iVar6;
  int iVar7;
  int extraout_EAX;
  undefined8 uVar8;
  void *pvVar9;
  ulong uVar10;
  bool bVar11;
  uv_loop_t *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_udp_t *puVar13;
  uv_udp_t *puVar14;
  ulong in_R8;
  char *unaff_R12;
  void *unaff_R13;
  uv_udp_t *unaff_R14;
  uv_udp_t *unaff_R15;
  int64_t eval_b;
  char dst [256];
  code *pcStack_1f8;
  uv_udp_t *puStack_1e8;
  uv_udp_t *puStack_1e0;
  uv_loop_t *puStack_1d8;
  uv_udp_recv_cb p_Stack_1a0;
  uv_loop_t *puStack_198;
  uv_loop_t *puStack_190;
  uv_udp_t *puStack_188;
  uv_loop_t *puStack_178;
  uv_loop_t *puStack_170;
  undefined1 auStack_168 [16];
  undefined8 auStack_158 [2];
  uv_handle_t *puStack_148;
  uv__queue *local_118;
  uv__queue *local_110;
  char local_108;
  uv_udp_t *puVar12;
  
  if (addr == (sockaddr *)0x0) {
    return 1;
  }
  local_118 = (uv__queue *)(ulong)addr->sa_family;
  if (local_118 == (uv__queue *)0xa) {
    iVar6 = uv_inet_ntop(10,addr->sa_data + 6,&local_118,0x100);
    if (iVar6 != 0) {
      return 0;
    }
    printf("from [%.*s]:%d\n",0x100,&local_118,(ulong)*(ushort *)addr->sa_data);
    if (*(uint16_t *)addr->sa_data == client_port) {
      if ((local_108 == '\0' && local_118 == (uv__queue *)0x313a666666663a3a) &&
          local_110 == (uv__queue *)0x312e302e302e3732) {
        return 1;
      }
      return 0;
    }
    return 0;
  }
  is_from_client_cold_1();
  puStack_188 = (uv_udp_t *)0x1dcc90;
  puStack_148 = (uv_handle_t *)addr;
  iVar6 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_158);
  auStack_168._0_8_ = SEXT48(iVar6);
  sVar1.sa_data[6] = auStack_168[8];
  sVar1.sa_data[7] = auStack_168[9];
  sVar1.sa_data[8] = auStack_168[10];
  sVar1.sa_data[9] = auStack_168[0xb];
  sVar1.sa_data[10] = auStack_168[0xc];
  sVar1.sa_data[0xb] = auStack_168[0xd];
  sVar1.sa_data[0xc] = auStack_168[0xe];
  sVar1.sa_data[0xd] = auStack_168[0xf];
  sVar1._0_8_ = auStack_168._0_8_;
  puStack_178 = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_168._0_8_ == (uv_loop_t *)0x0) {
    puStack_188 = (uv_udp_t *)0x1dccb5;
    uVar8 = uv_default_loop();
    puStack_188 = (uv_udp_t *)0x1dccc9;
    iVar6 = uv_udp_init_ex(uVar8,&recver,0x100);
    auStack_168._0_8_ = SEXT48(iVar6);
    sVar2.sa_data[6] = auStack_168[8];
    sVar2.sa_data[7] = auStack_168[9];
    sVar2.sa_data[8] = auStack_168[10];
    sVar2.sa_data[9] = auStack_168[0xb];
    sVar2.sa_data[10] = auStack_168[0xc];
    sVar2.sa_data[0xb] = auStack_168[0xd];
    sVar2.sa_data[0xc] = auStack_168[0xe];
    sVar2.sa_data[0xd] = auStack_168[0xf];
    sVar2._0_8_ = auStack_168._0_8_;
    puStack_178 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_168._0_8_ != (uv_loop_t *)0x0) goto LAB_001dcfea;
    puStack_188 = (uv_udp_t *)0x1dccfc;
    iVar6 = uv_udp_bind(&recver,auStack_158,0);
    auStack_168._0_8_ = SEXT48(iVar6);
    sVar3.sa_data[6] = auStack_168[8];
    sVar3.sa_data[7] = auStack_168[9];
    sVar3.sa_data[8] = auStack_168[10];
    sVar3.sa_data[9] = auStack_168[0xb];
    sVar3.sa_data[10] = auStack_168[0xc];
    sVar3.sa_data[0xb] = auStack_168[0xd];
    sVar3.sa_data[0xc] = auStack_168[0xe];
    sVar3.sa_data[0xd] = auStack_168[0xf];
    sVar3._0_8_ = auStack_168._0_8_;
    puStack_178 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_168._0_8_ != (uv_loop_t *)0x0) goto LAB_001dcff9;
    puStack_188 = (uv_udp_t *)0x1dcd36;
    iVar6 = uv_udp_recv_start(&recver,alloc_cb,recv_cb);
    auStack_168._0_8_ = SEXT48(iVar6);
    sVar4.sa_data[6] = auStack_168[8];
    sVar4.sa_data[7] = auStack_168[9];
    sVar4.sa_data[8] = auStack_168[10];
    sVar4.sa_data[9] = auStack_168[0xb];
    sVar4.sa_data[10] = auStack_168[0xc];
    sVar4.sa_data[0xb] = auStack_168[0xd];
    sVar4.sa_data[0xc] = auStack_168[0xe];
    sVar4.sa_data[0xd] = auStack_168[0xf];
    sVar4._0_8_ = auStack_168._0_8_;
    puStack_178 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_168._0_8_ != (uv_loop_t *)0x0) goto LAB_001dd008;
    puStack_188 = (uv_udp_t *)0x1dcd6c;
    iVar6 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_158);
    auStack_168._0_8_ = SEXT48(iVar6);
    sVar5.sa_data[6] = auStack_168[8];
    sVar5.sa_data[7] = auStack_168[9];
    sVar5.sa_data[8] = auStack_168[10];
    sVar5.sa_data[9] = auStack_168[0xb];
    sVar5.sa_data[10] = auStack_168[0xc];
    sVar5.sa_data[0xb] = auStack_168[0xd];
    sVar5.sa_data[0xc] = auStack_168[0xe];
    sVar5.sa_data[0xd] = auStack_168[0xf];
    sVar5._0_8_ = auStack_168._0_8_;
    puStack_178 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_168._0_8_ != (uv_loop_t *)0x0) goto LAB_001dd017;
    puStack_188 = (uv_udp_t *)0x1dcd91;
    uVar8 = uv_default_loop();
    puStack_188 = (uv_udp_t *)0x1dcda0;
    iVar6 = uv_udp_init(uVar8,&sender);
    auStack_168._0_8_ = SEXT48(iVar6);
    puStack_178 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_168._0_8_ != (uv_loop_t *)0x0) goto LAB_001dd026;
    puStack_188 = (uv_udp_t *)0x1dcdd1;
    auStack_168 = uv_buf_init("PING",4);
    addr = (sockaddr *)auStack_168;
    iVar6 = 0x28;
    unaff_R14 = &sender;
    unaff_R15 = (uv_udp_t *)auStack_158;
    do {
      puStack_178 = (uv_loop_t *)0x4;
      puStack_188 = (uv_udp_t *)0x1dce0a;
      iVar7 = uv_udp_try_send(&sender,addr,1,unaff_R15);
      puStack_170 = (uv_loop_t *)(long)iVar7;
      if (puStack_178 != puStack_170) {
        puStack_188 = (uv_udp_t *)0x1dcfdb;
        run_test_udp_mmsg_cold_7();
        sVar1 = (sockaddr)auStack_168;
        goto LAB_001dcfdb;
      }
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    puStack_188 = (uv_udp_t *)0x1dce2a;
    uVar8 = uv_default_loop();
    puStack_188 = (uv_udp_t *)0x1dce34;
    iVar6 = uv_run(uVar8,0);
    puStack_178 = (uv_loop_t *)(long)iVar6;
    puStack_170 = (uv_loop_t *)0x0;
    if (puStack_178 != (uv_loop_t *)0x0) goto LAB_001dd035;
    puStack_178 = (uv_loop_t *)0x2;
    puStack_170 = (uv_loop_t *)(long)close_cb_called;
    if (puStack_170 != (uv_loop_t *)0x2) goto LAB_001dd044;
    puStack_178 = (uv_loop_t *)(long)received_datagrams;
    puStack_170 = (uv_loop_t *)0x28;
    if (puStack_178 != (uv_loop_t *)0x28) goto LAB_001dd053;
    puStack_178 = (uv_loop_t *)sender.send_queue_size;
    puStack_170 = (uv_loop_t *)0x0;
    if (sender.send_queue_size != 0) goto LAB_001dd062;
    puStack_178 = (uv_loop_t *)recver.send_queue_size;
    puStack_170 = (uv_loop_t *)0x0;
    if (recver.send_queue_size != 0) goto LAB_001dd071;
    puStack_188 = (uv_udp_t *)0x1dcf02;
    printf("%d allocs for %d recvs\n",(ulong)(uint)alloc_cb_called,(ulong)(uint)recv_cb_called);
    puStack_188 = (uv_udp_t *)0x1dcf0e;
    iVar6 = uv_udp_using_recvmmsg(&recver);
    if (iVar6 != 0) {
      puStack_178 = (uv_loop_t *)(long)alloc_cb_called;
      puStack_170 = (uv_loop_t *)0x2;
      if (puStack_178 != (uv_loop_t *)0x2) {
        puStack_188 = (uv_udp_t *)0x1dcf42;
        run_test_udp_mmsg_cold_13();
        goto LAB_001dcf42;
      }
LAB_001dcf6a:
      puStack_188 = (uv_udp_t *)0x1dcf6f;
      addr = (sockaddr *)uv_default_loop();
      puStack_188 = (uv_udp_t *)0x1dcf83;
      uv_walk(addr,close_walk_cb,0);
      puStack_188 = (uv_udp_t *)0x1dcf8d;
      uv_run(addr,0);
      puStack_178 = (uv_loop_t *)0x0;
      puStack_188 = (uv_udp_t *)0x1dcf9b;
      uVar8 = uv_default_loop();
      puStack_188 = (uv_udp_t *)0x1dcfa3;
      iVar6 = uv_loop_close(uVar8);
      puStack_170 = (uv_loop_t *)(long)iVar6;
      if (puStack_178 == puStack_170) {
        puStack_188 = (uv_udp_t *)0x1dcfbf;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001dd080;
    }
LAB_001dcf42:
    puStack_178 = (uv_loop_t *)(long)alloc_cb_called;
    puStack_170 = (uv_loop_t *)(long)recv_cb_called;
    if (puStack_178 == puStack_170) goto LAB_001dcf6a;
  }
  else {
LAB_001dcfdb:
    puStack_188 = (uv_udp_t *)0x1dcfea;
    auStack_168 = (undefined1  [16])sVar1;
    run_test_udp_mmsg_cold_1();
    sVar2 = (sockaddr)auStack_168;
LAB_001dcfea:
    puStack_188 = (uv_udp_t *)0x1dcff9;
    auStack_168 = (undefined1  [16])sVar2;
    run_test_udp_mmsg_cold_2();
    sVar3 = (sockaddr)auStack_168;
LAB_001dcff9:
    puStack_188 = (uv_udp_t *)0x1dd008;
    auStack_168 = (undefined1  [16])sVar3;
    run_test_udp_mmsg_cold_3();
    sVar4 = (sockaddr)auStack_168;
LAB_001dd008:
    puStack_188 = (uv_udp_t *)0x1dd017;
    auStack_168 = (undefined1  [16])sVar4;
    run_test_udp_mmsg_cold_4();
    sVar5 = (sockaddr)auStack_168;
LAB_001dd017:
    puStack_188 = (uv_udp_t *)0x1dd026;
    auStack_168 = (undefined1  [16])sVar5;
    run_test_udp_mmsg_cold_5();
LAB_001dd026:
    puStack_188 = (uv_udp_t *)0x1dd035;
    run_test_udp_mmsg_cold_6();
LAB_001dd035:
    puStack_188 = (uv_udp_t *)0x1dd044;
    run_test_udp_mmsg_cold_8();
LAB_001dd044:
    puStack_188 = (uv_udp_t *)0x1dd053;
    run_test_udp_mmsg_cold_9();
LAB_001dd053:
    puStack_188 = (uv_udp_t *)0x1dd062;
    run_test_udp_mmsg_cold_10();
LAB_001dd062:
    puStack_188 = (uv_udp_t *)0x1dd071;
    run_test_udp_mmsg_cold_11();
LAB_001dd071:
    puStack_188 = (uv_udp_t *)0x1dd080;
    run_test_udp_mmsg_cold_12();
LAB_001dd080:
    puStack_188 = (uv_udp_t *)0x1dd08f;
    run_test_udp_mmsg_cold_15();
  }
  puVar12 = (uv_udp_t *)&puStack_178;
  puVar13 = (uv_udp_t *)&puStack_170;
  puStack_188 = (uv_udp_t *)alloc_cb;
  run_test_udp_mmsg_cold_14();
  bVar11 = puVar12 == &sender || puVar12 == &recver;
  puVar12 = (uv_udp_t *)CONCAT71(0xfccb,bVar11);
  puStack_198 = (uv_loop_t *)(ulong)bVar11;
  p_Stack_1a0 = (uv_udp_recv_cb)0x0;
  puStack_190 = (uv_loop_t *)addr;
  puStack_188 = unaff_R14;
  if (puStack_198 == (uv_loop_t *)0x0) {
    puVar14 = (uv_udp_t *)&puStack_198;
    puVar13 = (uv_udp_t *)&p_Stack_1a0;
    alloc_cb_cold_2();
  }
  else {
    iVar6 = uv_udp_using_recvmmsg();
    unaff_R14 = (uv_udp_t *)0x140000;
    if (iVar6 == 0) {
      unaff_R14 = (uv_udp_t *)0x10000;
    }
    puVar14 = unaff_R14;
    pvVar9 = malloc((size_t)unaff_R14);
    extraout_RDX->data = pvVar9;
    addr = (sockaddr *)extraout_RDX;
    if (pvVar9 != (void *)0x0) {
      *(uv_udp_t **)&extraout_RDX->active_handles = unaff_R14;
      alloc_cb_called = alloc_cb_called + 1;
      return (int)pvVar9;
    }
  }
  alloc_cb_cold_1();
  puStack_1e8 = (uv_udp_t *)0x0;
  puStack_1e0 = puVar13;
  puStack_1d8 = (uv_loop_t *)addr;
  if ((long)puVar13 < 0) {
    pcStack_1f8 = (code *)0x1dd276;
    recv_cb_cold_6();
LAB_001dd276:
    pcStack_1f8 = (code *)0x1dd285;
    recv_cb_cold_1();
LAB_001dd285:
    pcStack_1f8 = (code *)0x1dd294;
    recv_cb_cold_3();
LAB_001dd294:
    pcStack_1f8 = (code *)0x1dd299;
    recv_cb_cold_4();
LAB_001dd299:
    pcStack_1f8 = (code *)unaff_R13;
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%.*s %s %.*s)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-mmsg.c"
            ,0x5c,"\"PING\"","==","rcvbuf->base",unaff_R14,unaff_R12,"==",unaff_R14);
    pcStack_1f8 = (code *)0x1dd2e7;
    abort();
  }
  unaff_R14 = puVar13;
  if ((in_R8 & 0x10) == 0) {
    unaff_R15 = puVar14;
    if (puVar13 == (uv_udp_t *)0x0) goto LAB_001dd1f6;
    puStack_1e0 = (uv_udp_t *)0x4;
    puStack_1e8 = puVar13;
    if (puVar13 != (uv_udp_t *)0x4) goto LAB_001dd285;
    if (puVar12 == (uv_udp_t *)0x0) goto LAB_001dd294;
    unaff_R13 = (void *)*extraout_RDX_00;
    unaff_R12 = "PING";
    pcStack_1f8 = (code *)0x1dd1b3;
    iVar6 = bcmp("PING",unaff_R13,4);
    if (iVar6 != 0) goto LAB_001dd299;
    received_datagrams = received_datagrams + 1;
  }
  else {
    puStack_1e8 = (uv_udp_t *)0x0;
    if (puVar13 != (uv_udp_t *)0x0) goto LAB_001dd276;
    if (puVar12 == (uv_udp_t *)0x0) goto LAB_001dd242;
    pcStack_1f8 = (code *)0x1dd1f6;
    recv_cb_cold_2();
LAB_001dd1f6:
    if (puVar12 != (uv_udp_t *)0x0) {
      pcStack_1f8 = close_cb;
      recv_cb_cold_5();
      pcStack_1f8 = (code *)(ulong)(puVar12 == &sender || puVar12 == &recver);
      if (pcStack_1f8 == (code *)0x0) {
        puVar12 = (uv_udp_t *)&pcStack_1f8;
        close_cb_cold_2();
      }
      else {
        iVar6 = uv_is_closing();
        if (iVar6 != 0) {
          close_cb_called = close_cb_called + 1;
          return iVar6;
        }
      }
      close_cb_cold_1();
      iVar6 = uv_is_closing();
      if (iVar6 == 0) {
        iVar6 = uv_close(puVar12,0);
        return iVar6;
      }
      return iVar6;
    }
  }
  uVar10 = (ulong)(uint)received_datagrams;
  recv_cb_called = recv_cb_called + 1;
  if (received_datagrams == 0x28) {
    pcStack_1f8 = (code *)0x1dd222;
    uv_close(unaff_R15,close_cb);
    pcStack_1f8 = (code *)0x1dd231;
    uVar10 = uv_close(&sender,close_cb);
  }
  if ((char)(((uint)in_R8 & 8) >> 3) != '\0' || extraout_RDX_00 == (undefined8 *)0x0) {
    return (int)CONCAT71((int7)(uVar10 >> 8),extraout_RDX_00 == (undefined8 *)0x0);
  }
LAB_001dd242:
  free((void *)*extraout_RDX_00);
  return extraout_EAX;
}

Assistant:

static int is_from_client(const struct sockaddr* addr) {
  const struct sockaddr_in6* addr6;
  char dst[256];
  int r;

  /* Debugging output, and filter out unwanted network traffic */
  if (addr != NULL) {
    ASSERT_EQ(addr->sa_family, AF_INET6);
    addr6 = (struct sockaddr_in6*) addr;
    r = uv_inet_ntop(addr->sa_family, &addr6->sin6_addr, dst, sizeof(dst));
    if (r == 0)
      printf("from [%.*s]:%d\n", (int) sizeof(dst), dst, addr6->sin6_port);
    if (addr6->sin6_port != client_port)
      return 0;
    if (r != 0 || strcmp(dst, "::ffff:127.0.0.1"))
      return 0;
  }
  return 1;
}